

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_zlib.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::ReadCompressedBuffer
          (ON_BinaryArchive *this,size_t sizeof__outbuffer,void *outbuffer,bool *bFailedCRC)

{
  bool bVar1;
  ON__UINT32 OVar2;
  char method;
  uint buffer_crc0;
  byte local_2d;
  ON__UINT32 local_2c;
  
  local_2c = 0;
  local_2d = 0;
  if (bFailedCRC != (bool *)0x0) {
    *bFailedCRC = false;
  }
  bVar1 = ReadMode(this);
  if (bVar1) {
    if (sizeof__outbuffer == 0) {
      return true;
    }
    if ((((outbuffer != (void *)0x0) && (bVar1 = ReadInt(this,&local_2c), bVar1)) &&
        (bVar1 = ReadChar(this,(char *)&local_2d), bVar1)) && (local_2d < 2)) {
      if ((local_2d & 1) == 0) {
        bVar1 = ReadByte(this,sizeof__outbuffer,outbuffer);
      }
      else {
        bVar1 = CompressionInit(this);
        if (bVar1) {
          bVar1 = ReadInflate(this,sizeof__outbuffer,outbuffer);
        }
        CompressionEnd(this);
      }
      if (bVar1 == false) {
        return false;
      }
      OVar2 = ON_CRC32(0,sizeof__outbuffer,outbuffer);
      if (OVar2 == local_2c) {
        return bVar1;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_zlib.cpp"
                 ,0xd1,"","ON_BinaryArchive::ReadCompressedBuffer() crc error");
      if (bFailedCRC == (bool *)0x0) {
        return bVar1;
      }
      *bFailedCRC = true;
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_BinaryArchive::ReadCompressedBuffer( // read and uncompress
  size_t sizeof__outbuffer,  // sizeof of uncompressed buffer to read
  void* outbuffer,           // uncompressed output data returned here
  bool* bFailedCRC
  )
{
  bool rc = false;
  unsigned int buffer_crc0 = 0;
  unsigned int buffer_crc1 = 0;
  char method = 0;

  if ( bFailedCRC)
    *bFailedCRC = false;
  if ( !ReadMode() )
    return false;
  if ( 0 == sizeof__outbuffer )
    return true;
  if ( 0 == outbuffer )
    return false;

  if ( !ReadInt(&buffer_crc0) ) // 32 bit crc of uncompressed buffer
    return false;

  if ( !ReadChar(&method) )
    return false;

  if ( method != 0 && method != 1 )
    return false;

  switch(method)
  {
  case 0: // uncompressed
    rc = ReadByte(sizeof__outbuffer, outbuffer);
    break;
  case 1: // compressed
    rc = CompressionInit();
    if (rc)
      rc = ReadInflate( sizeof__outbuffer, outbuffer );
    CompressionEnd();
    break;
  }

  if (rc ) 
  {
    buffer_crc1 = ON_CRC32( 0, sizeof__outbuffer, outbuffer );
    if ( buffer_crc1 != buffer_crc0 ) 
    {
      ON_ERROR("ON_BinaryArchive::ReadCompressedBuffer() crc error");
      if ( bFailedCRC )
        *bFailedCRC = true;
    }
  }

  return rc;
}